

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

void feat_subvec_project(feat_t *fcb,mfcc_t ***inout_feat,uint32 nfr)

{
  int iVar1;
  mfcc_t *__src;
  int32 **ppiVar2;
  mfcc_t *pmVar3;
  long lVar4;
  mfcc_t *pmVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  
  if (nfr != 0 && fcb->subvecs != (int32 **)0x0) {
    uVar8 = 0;
    do {
      __src = fcb->sv_buf;
      iVar1 = fcb->n_sv;
      if (0 < (long)iVar1) {
        ppiVar2 = fcb->subvecs;
        lVar4 = 0;
        pmVar5 = __src;
        do {
          piVar6 = ppiVar2[lVar4];
          if ((piVar6 != (int *)0x0) && (iVar7 = *piVar6, iVar7 != -1)) {
            pmVar3 = *inout_feat[uVar8];
            do {
              piVar6 = piVar6 + 1;
              *pmVar5 = pmVar3[iVar7];
              pmVar5 = pmVar5 + 1;
              iVar7 = *piVar6;
            } while (iVar7 != -1);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != iVar1);
      }
      memcpy(*inout_feat[uVar8],__src,(long)fcb->sv_dim << 2);
      uVar8 = uVar8 + 1;
    } while (uVar8 != nfr);
  }
  return;
}

Assistant:

static void
feat_subvec_project(feat_t *fcb, mfcc_t ***inout_feat, uint32 nfr)
{
    uint32 i;

    if (fcb->subvecs == NULL)
        return;
    for (i = 0; i < nfr; ++i) {
        mfcc_t *out;
        int32 j;

        out = fcb->sv_buf;
        for (j = 0; j < fcb->n_sv; ++j) {
            int32 *d;
            for (d = fcb->subvecs[j]; d && *d != -1; ++d) {
                *out++ = inout_feat[i][0][*d];
            }
        }
        memcpy(inout_feat[i][0], fcb->sv_buf, fcb->sv_dim * sizeof(*fcb->sv_buf));
    }
}